

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v6::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  significand_type sVar1;
  buffer<char> *pbVar2;
  type tVar3;
  int iVar4;
  char *pcVar5;
  uint64_t uVar6;
  ulong uVar7;
  undefined8 extraout_RDX;
  bool bVar8;
  fp fVar9;
  fp fVar10;
  fp value_00;
  fp x;
  fp y;
  fp y_00;
  int local_2ec;
  int num_digits;
  char *local_2d0;
  fixed_handler handler_1;
  fp cached_pow_1;
  fp local_240;
  significand_type sStack_230;
  fp normalized;
  fp local_218;
  result local_204;
  char *pcStack_200;
  result result;
  grisu_shortest_handler handler;
  fp cached_pow;
  undefined1 local_150 [8];
  boundaries boundaries;
  fp fp_value;
  int cached_exp10;
  int min_exp;
  int exp;
  char local_11b [3];
  buffer<char> *pbStack_118;
  bool fixed;
  buffer<char> *buf_local;
  undefined1 auStack_108 [4];
  int precision_local;
  longdouble value_local;
  uint uStack_f4;
  float_specs specs_local;
  char digit_1;
  uint64_t remainder;
  anon_class_16_2_fdf32556 divmod_integral;
  uint32_t digit;
  result result_1;
  uint64_t fractional;
  undefined1 auStack_b8 [4];
  uint32_t integral;
  fp one;
  uint64_t local_98;
  result local_80;
  char digit_3;
  uint64_t remainder_1;
  anon_class_16_2_fdf32556 divmod_integral_1;
  uint32_t digit_2;
  result result_2;
  uint64_t fractional_1;
  undefined1 auStack_48 [4];
  uint32_t integral_1;
  fp one_1;
  uint64_t local_28;
  result local_c;
  
  _auStack_108 = value;
  pbStack_118 = buf;
  buf_local._4_4_ = precision;
  unique0x10000c44 = specs;
  if (value < (longdouble)0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/ZhiruiLi[P]GErr/thirdparty/fmt/include/fmt/format-inl.h"
                ,0x41d,"value is negative");
  }
  uStack_f4._0_1_ = specs._4_1_;
  local_11b[2] = (char)uStack_f4 == '\x02';
  if ((longdouble)0 < value) {
    uStack_f4 = specs._4_4_;
    if ((uStack_f4 >> 0x13 & 1) == 0) {
      _min_exp = specs;
      specs_local.precision = snprintf_float<long_double>(value,precision,specs,buf);
    }
    else {
      cached_exp10 = 0;
      fp_value._12_4_ = 0xffffffc4;
      fp_value.e = 0;
      if (precision < 0) {
        fp::fp((fp *)&boundaries.upper);
        if ((uStack_f4 >> 0x12 & 1) == 0) {
          _local_150 = fp::assign_with_boundaries<long_double>((fp *)&boundaries.upper,_auStack_108)
          ;
          uVar6 = local_150._8_8_;
        }
        else {
          _local_150 = fp::assign_float_with_boundaries<long_double>
                                 ((fp *)&boundaries.upper,_auStack_108);
          uVar6 = local_150._8_8_;
        }
        value_00._8_8_ = uVar6;
        value_00.f = (ulong)(uint)fp_value.f;
        fVar9 = normalize<0>((detail *)boundaries.upper,value_00);
        boundaries.upper = fVar9.f;
        fp_value.f._0_4_ = fVar9.e;
        fVar9 = get_cached_power(-0x7c - (uint)fp_value.f,&fp_value.e);
        x.e = (uint)fp_value.f;
        x.f = boundaries.upper;
        x._12_4_ = 0;
        y._12_4_ = 0;
        y.f = SUB128(fVar9._0_12_,0);
        y.e = SUB124(fVar9._0_12_,8);
        fVar10 = operator*(x,y);
        handler.diff = fVar10.f;
        fp_value.f._0_4_ = fVar10.e;
        boundaries.upper = handler.diff;
        uVar6 = multiply((uint64_t)local_150,fVar9.f);
        local_98 = multiply(boundaries.lower,fVar9.f);
        if ((int)(uint)fp_value.f < -0x3c || -0x20 < (int)(uint)fp_value.f) {
          __assert_fail("min_exp <= fp_value.e && fp_value.e <= -32",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ZhiruiLi[P]GErr/thirdparty/fmt/include/fmt/format-inl.h"
                        ,0x43d,
                        "int fmt::detail::format_float(T, int, float_specs, buffer<char> &) [T = long double]"
                       );
        }
        local_98 = local_98 + 1;
        pcStack_200 = buffer<char>::data(pbStack_118);
        handler.buf._0_4_ = 0;
        handler._8_8_ = local_98 - boundaries.upper;
        fp::fp(&local_218,local_98,(uint)fp_value.f);
        local_98 = local_98 - (uVar6 - 1);
        one._8_8_ = &stack0xfffffffffffffe00;
        fp::fp((fp *)auStack_b8,1L << (-(char)local_218.e & 0x3fU),local_218.e);
        uVar7 = local_218.f >> (-(char)(undefined4)one.f & 0x3fU);
        fractional._4_4_ = (uint32_t)uVar7;
        if (fractional._4_4_ == 0) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/ZhiruiLi[P]GErr/thirdparty/fmt/include/fmt/format-inl.h"
                      ,0x31c,"");
        }
        if ((uVar7 & 0xffffffff) != local_218.f >> (-(char)(undefined4)one.f & 0x3fU)) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/ZhiruiLi[P]GErr/thirdparty/fmt/include/fmt/format-inl.h"
                      ,0x31d,"");
        }
        _digit = local_218.f & _auStack_b8 - 1;
        cached_exp10 = grisu_count_digits(fractional._4_4_);
        local_80 = grisu_shortest_handler::on_start
                             ((grisu_shortest_handler *)one._8_8_,
                              *(long *)(basic_data<void>::powers_of_10_64 +
                                       (long)(cached_exp10 + -1) * 8) <<
                              (-(char)(undefined4)one.f & 0x3fU),local_218.f / 10,local_98 * 10,
                              &cached_exp10);
        if (local_80 == more) {
          do {
            divmod_integral.integral._4_4_ = 0;
            divmod_integral.integral._0_4_ = 0;
            remainder = (uint64_t)&divmod_integral.integral;
            divmod_integral.digit = (uint32_t *)((long)&fractional + 4);
            switch(cached_exp10) {
            case 1:
              divmod_integral.integral._0_4_ = fractional._4_4_;
              fractional._4_4_ = 0;
              break;
            case 2:
              grisu_gen_digits<fmt::v6::detail::grisu_shortest_handler>::anon_class_16_2_fdf32556::
              operator()((anon_class_16_2_fdf32556 *)&remainder,10);
              break;
            case 3:
              grisu_gen_digits<fmt::v6::detail::grisu_shortest_handler>::anon_class_16_2_fdf32556::
              operator()((anon_class_16_2_fdf32556 *)&remainder,100);
              break;
            case 4:
              grisu_gen_digits<fmt::v6::detail::grisu_shortest_handler>::anon_class_16_2_fdf32556::
              operator()((anon_class_16_2_fdf32556 *)&remainder,1000);
              break;
            case 5:
              grisu_gen_digits<fmt::v6::detail::grisu_shortest_handler>::anon_class_16_2_fdf32556::
              operator()((anon_class_16_2_fdf32556 *)&remainder,10000);
              break;
            case 6:
              grisu_gen_digits<fmt::v6::detail::grisu_shortest_handler>::anon_class_16_2_fdf32556::
              operator()((anon_class_16_2_fdf32556 *)&remainder,100000);
              break;
            case 7:
              grisu_gen_digits<fmt::v6::detail::grisu_shortest_handler>::anon_class_16_2_fdf32556::
              operator()((anon_class_16_2_fdf32556 *)&remainder,1000000);
              break;
            case 8:
              grisu_gen_digits<fmt::v6::detail::grisu_shortest_handler>::anon_class_16_2_fdf32556::
              operator()((anon_class_16_2_fdf32556 *)&remainder,10000000);
              break;
            case 9:
              grisu_gen_digits<fmt::v6::detail::grisu_shortest_handler>::anon_class_16_2_fdf32556::
              operator()((anon_class_16_2_fdf32556 *)&remainder,100000000);
              break;
            case 10:
              grisu_gen_digits<fmt::v6::detail::grisu_shortest_handler>::anon_class_16_2_fdf32556::
              operator()((anon_class_16_2_fdf32556 *)&remainder,1000000000);
              break;
            default:
              assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/ZhiruiLi[P]GErr/thirdparty/fmt/include/fmt/format-inl.h"
                          ,0x34f,"invalid number of digits");
            }
            cached_exp10 = cached_exp10 + -1;
            local_80 = grisu_shortest_handler::on_digit
                                 ((grisu_shortest_handler *)one._8_8_,
                                  (char)(uint32_t)divmod_integral.integral + '0',
                                  *(long *)(basic_data<void>::powers_of_10_64 +
                                           (long)cached_exp10 * 8) <<
                                  (-(char)(undefined4)one.f & 0x3fU),
                                  ((ulong)fractional._4_4_ << (-(char)(undefined4)one.f & 0x3fU)) +
                                  _digit,local_98,cached_exp10,true);
            if (local_80 != more) goto LAB_0010c494;
          } while (0 < cached_exp10);
          do {
            divmod_integral.integral._4_4_ = 0;
            local_98 = local_98 * 10;
            specs_local._7_1_ = (char)(_digit * 10 >> (-(char)(undefined4)one.f & 0x3fU)) + '0';
            _digit = _auStack_b8 - 1 & _digit * 10;
            cached_exp10 = cached_exp10 + -1;
            local_80 = grisu_shortest_handler::on_digit
                                 ((grisu_shortest_handler *)one._8_8_,specs_local._7_1_,_auStack_b8,
                                  _digit,local_98,cached_exp10,false);
          } while (local_80 == more);
        }
LAB_0010c494:
        pbVar2 = pbStack_118;
        local_204 = local_80;
        divmod_integral.integral._4_4_ = local_80;
        if (local_80 == error) {
          cached_exp10 = ((int)handler.buf - fp_value.e) + -1 + cached_exp10;
          fallback_format<long_double>(_auStack_108,pbStack_118,&cached_exp10);
          return cached_exp10;
        }
        tVar3 = to_unsigned<int>((int)handler.buf);
        buffer<char>::resize(pbVar2,(ulong)tVar3);
      }
      else {
        if (0x11 < precision) {
          normalized._8_8_ = specs;
          iVar4 = snprintf_float<long_double>(value,precision,specs,buf);
          return iVar4;
        }
        fp::fp<long_double>(&local_240,value);
        fVar9.f = (ulong)(uint)local_240.e;
        fVar9._8_8_ = extraout_RDX;
        fVar9 = normalize<0>((detail *)local_240.f,fVar9);
        sStack_230 = fVar9.f;
        normalized.f._0_4_ = fVar9.e;
        fVar9 = get_cached_power(-0x7c - (int)normalized.f,&fp_value.e);
        fVar10.e = (int)normalized.f;
        fVar10.f = sStack_230;
        fVar10._12_4_ = 0;
        y_00._12_4_ = 0;
        y_00.f = SUB128(fVar9._0_12_,0);
        y_00.e = SUB124(fVar9._0_12_,8);
        fVar9 = operator*(fVar10,y_00);
        handler_1._16_8_ = fVar9.f;
        normalized.f._0_4_ = fVar9.e;
        sStack_230 = handler_1._16_8_;
        local_2d0 = buffer<char>::data(pbStack_118);
        sVar1 = sStack_230;
        handler_1.buf._0_4_ = 0;
        handler_1.buf._4_4_ = buf_local._4_4_;
        handler_1.size = -fp_value.e;
        handler_1.precision._0_1_ = local_11b[2] & 1;
        local_28 = 1;
        one_1._8_8_ = &local_2d0;
        fp::fp((fp *)auStack_48,1L << (-(char)(int)normalized.f & 0x3fU),(int)normalized.f);
        uVar7 = sVar1 >> (-(char)(undefined4)one_1.f & 0x3fU);
        fractional_1._4_4_ = (uint32_t)uVar7;
        if (fractional_1._4_4_ == 0) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/ZhiruiLi[P]GErr/thirdparty/fmt/include/fmt/format-inl.h"
                      ,0x31c,"");
        }
        if ((uVar7 & 0xffffffff) != sVar1 >> (-(char)(undefined4)one_1.f & 0x3fU)) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/ZhiruiLi[P]GErr/thirdparty/fmt/include/fmt/format-inl.h"
                      ,0x31d,"");
        }
        _digit_2 = sVar1 & _auStack_48 - 1;
        cached_exp10 = grisu_count_digits(fractional_1._4_4_);
        local_c = fixed_handler::on_start
                            ((fixed_handler *)one_1._8_8_,
                             *(long *)(basic_data<void>::powers_of_10_64 +
                                      (long)(cached_exp10 + -1) * 8) <<
                             (-(char)(undefined4)one_1.f & 0x3fU),sVar1 / 10,10,&cached_exp10);
        if (local_c == more) {
          do {
            divmod_integral_1.integral._4_4_ = 0;
            divmod_integral_1.integral._0_4_ = 0;
            remainder_1 = (uint64_t)&divmod_integral_1.integral;
            divmod_integral_1.digit = (uint32_t *)((long)&fractional_1 + 4);
            switch(cached_exp10) {
            case 1:
              divmod_integral_1.integral._0_4_ = fractional_1._4_4_;
              fractional_1._4_4_ = 0;
              break;
            case 2:
              grisu_gen_digits<fmt::v6::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                        ((anon_class_16_2_fdf32556 *)&remainder_1,10);
              break;
            case 3:
              grisu_gen_digits<fmt::v6::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                        ((anon_class_16_2_fdf32556 *)&remainder_1,100);
              break;
            case 4:
              grisu_gen_digits<fmt::v6::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                        ((anon_class_16_2_fdf32556 *)&remainder_1,1000);
              break;
            case 5:
              grisu_gen_digits<fmt::v6::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                        ((anon_class_16_2_fdf32556 *)&remainder_1,10000);
              break;
            case 6:
              grisu_gen_digits<fmt::v6::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                        ((anon_class_16_2_fdf32556 *)&remainder_1,100000);
              break;
            case 7:
              grisu_gen_digits<fmt::v6::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                        ((anon_class_16_2_fdf32556 *)&remainder_1,1000000);
              break;
            case 8:
              grisu_gen_digits<fmt::v6::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                        ((anon_class_16_2_fdf32556 *)&remainder_1,10000000);
              break;
            case 9:
              grisu_gen_digits<fmt::v6::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                        ((anon_class_16_2_fdf32556 *)&remainder_1,100000000);
              break;
            case 10:
              grisu_gen_digits<fmt::v6::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                        ((anon_class_16_2_fdf32556 *)&remainder_1,1000000000);
              break;
            default:
              assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/ZhiruiLi[P]GErr/thirdparty/fmt/include/fmt/format-inl.h"
                          ,0x34f,"invalid number of digits");
            }
            cached_exp10 = cached_exp10 + -1;
            local_c = fixed_handler::on_digit
                                ((fixed_handler *)one_1._8_8_,
                                 (char)(uint32_t)divmod_integral_1.integral + '0',
                                 *(long *)(basic_data<void>::powers_of_10_64 +
                                          (long)cached_exp10 * 8) <<
                                 (-(char)(undefined4)one_1.f & 0x3fU),
                                 ((ulong)fractional_1._4_4_ << (-(char)(undefined4)one_1.f & 0x3fU))
                                 + _digit_2,1,cached_exp10,true);
            if (local_c != more) goto LAB_0010ca21;
          } while (0 < cached_exp10);
          do {
            divmod_integral_1.integral._4_4_ = 0;
            uVar7 = _digit_2 * 10;
            local_28 = local_28 * 10;
            _digit_2 = _auStack_48 - 1 & uVar7;
            cached_exp10 = cached_exp10 + -1;
            local_c = fixed_handler::on_digit
                                ((fixed_handler *)one_1._8_8_,
                                 (char)(uVar7 >> (-(char)(undefined4)one_1.f & 0x3fU)) + '0',
                                 _auStack_48,_digit_2,local_28,cached_exp10,false);
          } while (local_c == more);
        }
LAB_0010ca21:
        divmod_integral_1.integral._4_4_ = local_c;
        if (local_c == error) {
          iVar4 = snprintf_float<long_double>
                            (_auStack_108,buf_local._4_4_,stack0xffffffffffffff08,pbStack_118);
          return iVar4;
        }
        local_2ec = (int)handler_1.buf;
        if ((local_11b[2] & 1U) == 0) {
          while( true ) {
            bVar8 = false;
            if (0 < local_2ec) {
              pcVar5 = buffer<char>::operator[]<int>(pbStack_118,local_2ec + -1);
              bVar8 = *pcVar5 == '0';
            }
            if (!bVar8) break;
            local_2ec = local_2ec + -1;
            cached_exp10 = cached_exp10 + 1;
          }
        }
        pbVar2 = pbStack_118;
        tVar3 = to_unsigned<int>(local_2ec);
        buffer<char>::resize(pbVar2,(ulong)tVar3);
      }
      specs_local.precision = cached_exp10 - fp_value.e;
    }
  }
  else if ((precision < 1) || (!(bool)local_11b[2])) {
    local_11b[1] = 0x30;
    buffer<char>::push_back(buf,local_11b + 1);
    specs_local.precision = 0;
  }
  else {
    tVar3 = to_unsigned<int>(precision);
    buffer<char>::resize(buf,(ulong)tVar3);
    pcVar5 = buffer<char>::data(pbStack_118);
    local_11b[0] = '0';
    std::uninitialized_fill_n<char*,int,char>(pcVar5,buf_local._4_4_,local_11b);
    specs_local.precision = -buf_local._4_4_;
  }
  return specs_local.precision;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}